

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

void kwsysProcessClosePipes(cmsysProcess *cp)

{
  uint uVar1;
  ulong uVar2;
  ssize_t sVar3;
  int *piVar4;
  long lVar5;
  
  lVar5 = 0;
  do {
    if (lVar5 == 3) {
      return;
    }
    uVar1 = cp->PipeReadEnds[lVar5];
    if (-1 < (int)uVar1) {
      uVar2 = (cp->PipeSet).__fds_bits[uVar1 >> 6];
      if ((uVar2 >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
        (cp->PipeSet).__fds_bits[uVar1 >> 6] = uVar2 & ~(1L << ((byte)uVar1 & 0x3f));
        do {
          sVar3 = read(cp->PipeReadEnds[lVar5],cp->PipeBuffer,0x400);
          if (-1 < sVar3) break;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
      }
      kwsysProcessCleanupDescriptor(cp->PipeReadEnds + lVar5);
      cp->PipesLeft = cp->PipesLeft + -1;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

static void kwsysProcessClosePipes(kwsysProcess* cp)
{
  int i;

  /* Close any pipes that are still open.  */
  for(i=0; i < KWSYSPE_PIPE_COUNT; ++i)
    {
    if(cp->PipeReadEnds[i] >= 0)
      {
#if KWSYSPE_USE_SELECT
      /* If the pipe was reported by the last call to select, we must
         read from it.  This is needed to satisfy the suggestions from
         "man select_tut" and is not needed for the polling
         implementation.  Ignore the data.  */
      if(FD_ISSET(cp->PipeReadEnds[i], &cp->PipeSet))
        {
        /* We are handling this pipe now.  Remove it from the set.  */
        FD_CLR(cp->PipeReadEnds[i], &cp->PipeSet);

        /* The pipe is ready to read without blocking.  Keep trying to
           read until the operation is not interrupted.  */
        while((read(cp->PipeReadEnds[i], cp->PipeBuffer,
                    KWSYSPE_PIPE_BUFFER_SIZE) < 0) && (errno == EINTR));
        }
#endif

      /* We are done reading from this pipe.  */
      kwsysProcessCleanupDescriptor(&cp->PipeReadEnds[i]);
      --cp->PipesLeft;
      }
    }
}